

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

int __thiscall sysapi::epoll::run_timers_calculate_timeout(epoll *this)

{
  bool bVar1;
  time_point now;
  time_point tVar2;
  timer *this_00;
  int iVar3;
  
  this_00 = &this->timer_;
  bVar1 = timer::empty(this_00);
  iVar3 = -1;
  if (!bVar1) {
    now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    timer::notify(this_00,now);
    bVar1 = timer::empty(this_00);
    if (!bVar1) {
      tVar2 = timer::top(this_00);
      iVar3 = (int)(((long)tVar2.__d.__r - (long)now.__d.__r) / 1000000);
    }
  }
  return iVar3;
}

Assistant:

int epoll::run_timers_calculate_timeout()
{
    if (timer_.empty())
        return -1;

    timer::clock_t::time_point now = timer::clock_t::now();
    timer_.notify(now);

    if (timer_.empty())
        return -1;

    return std::chrono::duration_cast<std::chrono::milliseconds>(timer_.top() - now).count();
}